

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGStreamPostalService.h
# Opt level: O2

bool __thiscall VCGStreamPostalService::StartService(VCGStreamPostalService *this)

{
  scoped_lock Lock;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Head_base<0UL,_VCGStreamPostalService_*,_false> local_38;
  unique_lock<boost::mutex> local_30;
  thread local_20;
  
  boost::unique_lock<boost::mutex>::unique_lock(&local_30,&this->m_Mutex);
  if ((this->m_pService).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::make_shared<boost::asio::io_context>();
    std::__shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_pService).
                super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  }
  if ((this->m_pWork).super___shared_ptr<boost::asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    std::make_shared<boost::asio::io_context::work,boost::asio::io_context&>((io_context *)local_48)
    ;
    std::__shared_ptr<boost::asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_pWork).
                super___shared_ptr<boost::asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<boost::asio::io_context::work,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    local_48 = (undefined1  [8])ThreadFunction;
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38._M_head_impl = this;
    boost::thread::thread<std::_Bind<void(VCGStreamPostalService::*(VCGStreamPostalService*))()>>
              (&local_20,
               (_Bind<void_(VCGStreamPostalService::*(VCGStreamPostalService_*))()> *)local_48);
    boost::thread::operator=(&this->m_Thread,&local_20);
    boost::thread::~thread(&local_20);
  }
  boost::unique_lock<boost::mutex>::~unique_lock(&local_30);
  return true;
}

Assistant:

bool StartService()
  {
    boost::mutex::scoped_lock Lock( m_Mutex );
    if( !m_pService )
    {
      m_pService = std::make_shared< boost::asio::io_service >();
    }

    if( !m_pWork )
    {
      m_pWork = std::make_shared< boost::asio::io_service::work >( *m_pService );
      m_Thread = boost::thread( std::bind( &VCGStreamPostalService::ThreadFunction, this ) );
    }

    return true;
  }